

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O1

ssize_t recv(int __fd,void *__buf,size_t __n,int __flags)

{
  uint uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  ssize_t sVar5;
  uint *puVar6;
  rpchook_t *prVar7;
  uint __timeout;
  pollfd pf;
  pollfd local_38;
  
  if (g_sys_recv_func == (recv_pfn_t)0x0) {
    g_sys_recv_func = (recv_pfn_t)dlsym(0xffffffffffffffff,"recv");
  }
  bVar3 = co_is_enable_sys_hook();
  if (bVar3) {
    if ((uint)__fd < 1000000) {
      prVar7 = g_rpchook_socket_fd[(uint)__fd];
    }
    else {
      prVar7 = (rpchook_t *)0x0;
    }
    if ((prVar7 != (rpchook_t *)0x0) && ((prVar7->user_flag & 0x800) == 0)) {
      auVar2 = SEXT816(0x20c49ba5e353f7cf) * SEXT816((prVar7->read_timeout).tv_usec);
      __timeout = ((int)(auVar2._8_8_ >> 7) - (auVar2._12_4_ >> 0x1f)) +
                  (int)(prVar7->read_timeout).tv_sec * 1000;
      local_38.events = 0x19;
      local_38.fd = __fd;
      local_38.revents = 0;
      uVar4 = poll(&local_38,1,__timeout);
      sVar5 = (*g_sys_recv_func)(__fd,__buf,__n,__flags);
      if (sVar5 < 0) {
        puVar6 = (uint *)__errno_location();
        uVar1 = *puVar6;
        co_log_err("CO_ERR: read fd %d ret %ld errno %d poll ret %d timeout %d",(ulong)(uint)__fd,
                   sVar5,(ulong)uVar1,(ulong)uVar4,(ulong)__timeout);
        uVar4 = 0x7c5;
        if (uVar1 != 0xb) {
          uVar4 = uVar1;
        }
        *puVar6 = uVar4;
      }
      return sVar5;
    }
  }
  sVar5 = (*g_sys_recv_func)(__fd,__buf,__n,__flags);
  return sVar5;
}

Assistant:

ssize_t recv( int socket, void *buffer, size_t length, int flags )
{
	HOOK_SYS_FUNC( recv );
	
	if( !co_is_enable_sys_hook() )
	{
		return g_sys_recv_func( socket,buffer,length,flags );
	}
	rpchook_t *lp = get_by_fd( socket );

	if( !lp || ( O_NONBLOCK & lp->user_flag ) ) 
	{
		return g_sys_recv_func( socket,buffer,length,flags );
	}
	int timeout = ( lp->read_timeout.tv_sec * 1000 ) 
				+ ( lp->read_timeout.tv_usec / 1000 );

	struct pollfd pf = { 0 };
	pf.fd = socket;
	pf.events = ( POLLIN | POLLERR | POLLHUP );

	int pollret = poll( &pf,1,timeout );

	ssize_t readret = g_sys_recv_func( socket,buffer,length,flags );

	if( readret < 0 )
	{
		int _set_errno = errno;
		co_log_err("CO_ERR: read fd %d ret %ld errno %d poll ret %d timeout %d",
					socket,readret,errno,pollret,timeout);
		errno = _set_errno;
		if(errno == EAGAIN){
			errno = LIBCO_POLL_TIMEOUT;
		}

	}

	return readret;
	
}